

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertHelper *this_01;
  AssertionResult gtest_ar;
  ParticleType particle;
  double *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffffa0;
  AssertionResult local_50;
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
            (in_stack_ffffffffffffffa0);
  pica::Constants<double>::electronCharge();
  this_01 = (AssertHelper *)
            pica::Particle<(pica::Dimension)1>::getCharge
                      ((Particle<(pica::Dimension)1> *)&stack0xffffffffffffffc0);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,
             (double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x204c39)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
               ,in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x204c87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x204ce7);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetCharge)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;

    ParticleType particle = this->randomParticle();
    ASSERT_EQ(pica::Constants<ChargeType>::electronCharge(), particle.getCharge());
}